

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraylist.c
# Opt level: O3

int array_list_del_idx(array_list *arr,size_t idx,size_t count)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  
  iVar1 = -1;
  uVar4 = count + idx;
  if ((!CARRY8(count,idx)) && (uVar2 = arr->length, uVar4 <= uVar2 && idx < uVar2)) {
    sVar3 = idx;
    sVar5 = count;
    if (idx < uVar4) {
      do {
        if (arr->array[sVar3] != (void *)0x0) {
          (*arr->free_fn)(arr->array[sVar3]);
        }
        sVar5 = sVar5 - 1;
        sVar3 = sVar3 + 1;
      } while (sVar5 != 0);
      uVar2 = arr->length;
    }
    memmove(arr->array + idx,arr->array + uVar4,(uVar2 - uVar4) * 8);
    arr->length = arr->length - count;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int array_list_del_idx(struct array_list *arr, size_t idx, size_t count)
{
	size_t i, stop;

	/* Avoid overflow in calculation with large indices. */
	if (idx > SIZE_T_MAX - count)
		return -1;
	stop = idx + count;
	if (idx >= arr->length || stop > arr->length)
		return -1;
	for (i = idx; i < stop; ++i)
	{
		// Because put_idx can skip entries, we need to check if
		// there's actually anything in each slot we're erasing.
		if (arr->array[i])
			arr->free_fn(arr->array[i]);
	}
	memmove(arr->array + idx, arr->array + stop, (arr->length - stop) * sizeof(void *));
	arr->length -= count;
	return 0;
}